

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O0

uint64_t mpack_node_u64(mpack_node_t node)

{
  mpack_error_t mVar1;
  mpack_node_data_t *pmVar2;
  mpack_node_t node_local;
  
  pmVar2 = node.data;
  mVar1 = mpack_node_error(node);
  if (mVar1 == mpack_ok) {
    if (pmVar2->type == mpack_type_uint) {
      node_local.tree = (mpack_tree_t *)(pmVar2->value).children;
    }
    else if ((pmVar2->type == mpack_type_int) && (-1 < (pmVar2->value).i)) {
      node_local.tree = (mpack_tree_t *)(pmVar2->value).children;
    }
    else {
      mpack_node_flag_error(node,mpack_error_type);
      node_local.tree = (mpack_tree_t *)0x0;
    }
  }
  else {
    node_local.tree = (mpack_tree_t *)0x0;
  }
  return (uint64_t)node_local.tree;
}

Assistant:

MPACK_INLINE uint64_t mpack_node_u64(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    if (node.data->type == mpack_type_uint) {
        return node.data->value.u;
    } else if (node.data->type == mpack_type_int) {
        if (node.data->value.i >= 0)
            return (uint64_t)node.data->value.i;
    }

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}